

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExtendsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExtendsClauseSyntax,slang::syntax::ExtendsClauseSyntax_const&>
          (BumpAllocator *this,ExtendsClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  NameSyntax *pNVar4;
  DefaultExtendsClauseArgSyntax *pDVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  SyntaxKind SVar10;
  undefined4 uVar11;
  ExtendsClauseSyntax *pEVar12;
  
  pEVar12 = (ExtendsClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExtendsClauseSyntax *)this->endPtr < pEVar12 + 1) {
    pEVar12 = (ExtendsClauseSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pEVar12 + 1);
  }
  SVar10 = (args->super_SyntaxNode).kind;
  uVar11 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->keyword).kind;
  uVar7 = (args->keyword).field_0x2;
  NVar8.raw = (args->keyword).numFlags.raw;
  uVar9 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  pNVar4 = (args->baseName).ptr;
  pDVar5 = args->defaultedArg;
  pEVar12->arguments = args->arguments;
  pEVar12->defaultedArg = pDVar5;
  (pEVar12->keyword).info = pIVar3;
  (pEVar12->baseName).ptr = pNVar4;
  (pEVar12->super_SyntaxNode).previewNode = pSVar2;
  (pEVar12->keyword).kind = TVar6;
  (pEVar12->keyword).field_0x2 = uVar7;
  (pEVar12->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar12->keyword).rawLen = uVar9;
  (pEVar12->super_SyntaxNode).kind = SVar10;
  *(undefined4 *)&(pEVar12->super_SyntaxNode).field_0x4 = uVar11;
  (pEVar12->super_SyntaxNode).parent = pSVar1;
  return pEVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }